

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferTests.cpp
# Opt level: O2

void __thiscall
vkt::sparse::anon_unknown_0::IndirectBufferTestInstance::initializeBuffers
          (IndirectBufferTestInstance *this)

{
  DeviceDriver *vk;
  VkDevice pVVar1;
  Allocation *pAVar2;
  VkDeviceSize VVar3;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  VkAllocationCallbacks *pVVar4;
  undefined4 *puVar5;
  long lVar6;
  float in_XMM2_Da;
  float in_XMM3_Da;
  Handle<(vk::HandleType)8> HVar7;
  DeviceInterface *pDVar8;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_88;
  VkBufferCreateInfo local_60;
  
  vk = (this->super_DrawGridTestInstance).super_SparseBufferTestInstance.
       super_SparseResourcesBaseInstance.m_deviceDriver.
       super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>.m_data.ptr;
  pVVar1 = (this->super_DrawGridTestInstance).super_SparseBufferTestInstance.
           super_SparseResourcesBaseInstance.m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.
           object;
  makeBufferCreateInfo(&local_60,0x60,0x80);
  makeBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&local_88,&vk->super_DeviceInterface,pVVar1,
             &local_60);
  pVVar4 = local_88.m_data.deleter.m_allocator;
  pVVar1 = local_88.m_data.deleter.m_device;
  pDVar8 = local_88.m_data.deleter.m_deviceIface;
  HVar7.m_internal = local_88.m_data.object.m_internal;
  local_88.m_data.object.m_internal = 0;
  local_88.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_88.m_data.deleter.m_device = (VkDevice)0x0;
  local_88.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset
            (&(this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       pVVar1;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       pVVar4;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       HVar7.m_internal;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
       = pDVar8;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_88);
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_60,
             &vk->super_DeviceInterface,
             (this->super_DrawGridTestInstance).super_SparseBufferTestInstance.
             super_SparseResourcesBaseInstance.m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.
             m_data.object,
             (this->super_DrawGridTestInstance).super_SparseBufferTestInstance.
             super_SparseResourcesBaseInstance.m_allocator.
             super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr,
             (VkBuffer)
             (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,(MemoryRequirement)0x1);
  local_60.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  local_60._4_4_ = 0;
  data._8_8_ = pDVar8;
  data.ptr = (Allocation *)HVar7.m_internal;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
            (&(this->m_vertexBufferAlloc).
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>,data);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_60);
  generateGrid(((this->m_vertexBufferAlloc).
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_hostPtr,2.0,-1.0,in_XMM2_Da,1,1,in_XMM3_Da);
  pAVar2 = (this->m_vertexBufferAlloc).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::flushMappedMemoryRange
            (&vk->super_DeviceInterface,
             (this->super_DrawGridTestInstance).super_SparseBufferTestInstance.
             super_SparseResourcesBaseInstance.m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.
             m_data.object,(VkDeviceMemory)(pAVar2->m_memory).m_internal,pAVar2->m_offset,0x60);
  VVar3 = (this->super_DrawGridTestInstance).m_perDrawBufferOffset;
  puVar5 = (undefined4 *)
           ((long)((this->super_DrawGridTestInstance).m_stagingBufferAlloc.
                   super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)
                  ->m_hostPtr + 0xc);
  for (lVar6 = 0; lVar6 != 6; lVar6 = lVar6 + 3) {
    puVar5[-1] = (int)lVar6;
    *puVar5 = 0;
    *(undefined8 *)(puVar5 + -3) = 0x100000003;
    puVar5 = (undefined4 *)((long)puVar5 + VVar3);
  }
  return;
}

Assistant:

void initializeBuffers (void)
	{
		// Vertex buffer
		const DeviceInterface&	vk					= getDeviceInterface();
		const VkDeviceSize		vertexBufferSize	= 2 * 3 * sizeof(Vec4);
								m_vertexBuffer		= makeBuffer(vk, getDevice(), makeBufferCreateInfo(vertexBufferSize, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT));
								m_vertexBufferAlloc	= bindBuffer(vk, getDevice(), getAllocator(), *m_vertexBuffer, MemoryRequirement::HostVisible);

		{
			generateGrid(m_vertexBufferAlloc->getHostPtr(), 2.0f, -1.0f, -1.0f, 1, 1);
			flushMappedMemoryRange(vk, getDevice(), m_vertexBufferAlloc->getMemory(), m_vertexBufferAlloc->getOffset(), vertexBufferSize);
		}

		// Indirect buffer
		for (deUint32 chunkNdx = 0u; chunkNdx < 2; ++chunkNdx)
		{
			deUint8* const					pData		= static_cast<deUint8*>(m_stagingBufferAlloc->getHostPtr()) + chunkNdx * m_perDrawBufferOffset;
			VkDrawIndirectCommand* const	pCmdData	= reinterpret_cast<VkDrawIndirectCommand*>(pData);

			pCmdData->firstVertex	= 3u * chunkNdx;
			pCmdData->firstInstance	= 0u;
			pCmdData->vertexCount	= 3u;
			pCmdData->instanceCount	= 1u;
		}
	}